

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

void __thiscall read_node_v10::operator()(read_node_v10 *this,ai_node *node,xr_reader *r)

{
  uint16_t *puVar1;
  uint32_t uVar2;
  
  xray_re::xr_reader::r_cseq<unsigned_char>(r,0xc,node->data);
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  node->cover = *puVar1;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  node->low_cover = *puVar1;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  node->plane = *puVar1;
  uVar2 = xray_re::xr_reader::r_u24(r);
  node->packed_xz = uVar2;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  node->packed_y = *puVar1;
  return;
}

Assistant:

void operator()(ai_node& node, xr_reader& r) const {
	r.r_cseq(12, node.data);
	node.cover = r.r_u16();
	node.low_cover = r.r_u16();
	node.plane = r.r_u16();
	node.packed_xz = r.r_u24();
	node.packed_y = r.r_u16();
}